

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

bool __thiscall HighsMipSolverData::checkLimits(HighsMipSolverData *this,int64_t nodeOffset)

{
  double dVar1;
  int iVar2;
  HighsMipSolver *pHVar3;
  HighsOptions *pHVar4;
  bool bVar5;
  long lVar6;
  HighsLp *in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  char *format;
  HighsModelStatus HVar7;
  double extraout_XMM0_Qa;
  string local_50;
  
  pHVar3 = this->mipsolver;
  pHVar4 = pHVar3->options_mip_;
  if ((pHVar3->submip == false) &&
     ((pHVar3->callback_->user_callback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    HighsCallback::clearHighsCallbackDataOut(pHVar3->callback_);
    dVar1 = this->mipsolver->solution_objective_;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MIP check limits","");
    bVar5 = interruptFromCallbackWithData(this,6,dVar1,&local_50);
    in_RDX = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      in_RDX = extraout_RDX_00;
    }
    if (bVar5) {
      if (this->mipsolver->modelstatus_ != kMin) {
        return true;
      }
      HVar7 = kInterrupt;
      format = "User interrupt\n";
      goto LAB_002be935;
    }
  }
  pHVar3 = this->mipsolver;
  if ((((pHVar3->submip != false) || (pHVar3->solution_objective_ == INFINITY)) ||
      (dVar1 = (pHVar4->super_HighsOptionsStruct).objective_target, dVar1 == -INFINITY)) ||
     (in_RCX = pHVar3->orig_model_,
     dVar1 * (double)in_RCX->sense_ <= pHVar3->solution_objective_ * (double)in_RCX->sense_)) {
    lVar6 = (long)(pHVar4->super_HighsOptionsStruct).mip_max_nodes;
    if ((lVar6 == 0x7fffffff) || (nodeOffset + this->num_nodes < lVar6)) {
      lVar6 = (long)(pHVar4->super_HighsOptionsStruct).mip_max_leaves;
      if ((lVar6 == 0x7fffffff) || (this->num_leaves < lVar6)) {
        iVar2 = (pHVar4->super_HighsOptionsStruct).mip_max_improving_sols;
        if ((iVar2 == 0x7fffffff) || (this->numImprovingSols < iVar2)) {
          if ((pHVar4->super_HighsOptionsStruct).time_limit == INFINITY) {
            return false;
          }
          HighsTimer::read(&this->mipsolver->timer_,0,in_RDX,(size_t)in_RCX);
          if (extraout_XMM0_Qa < (pHVar4->super_HighsOptionsStruct).time_limit) {
            return false;
          }
          if (this->mipsolver->modelstatus_ != kMin) {
            return true;
          }
          HVar7 = kTimeLimit;
          format = "Reached time limit\n";
        }
        else {
          if (this->mipsolver->modelstatus_ != kMin) {
            return true;
          }
          HVar7 = kSolutionLimit;
          format = "Reached improving solution limit\n";
        }
      }
      else {
        if (this->mipsolver->modelstatus_ != kMin) {
          return true;
        }
        HVar7 = kSolutionLimit;
        format = "Reached leaf node limit\n";
      }
    }
    else {
      if (this->mipsolver->modelstatus_ != kMin) {
        return true;
      }
      HVar7 = kSolutionLimit;
      format = "Reached node limit\n";
    }
  }
  else {
    if (pHVar3->modelstatus_ != kMin) {
      return true;
    }
    HVar7 = kObjectiveTarget;
    format = "Reached objective target\n";
  }
LAB_002be935:
  highsLogDev(&(pHVar4->super_HighsOptionsStruct).log_options,kInfo,format);
  this->mipsolver->modelstatus_ = HVar7;
  return true;
}

Assistant:

bool HighsMipSolverData::checkLimits(int64_t nodeOffset) const {
  const HighsOptions& options = *mipsolver.options_mip_;

  // Possible user interrupt
  if (!mipsolver.submip && mipsolver.callback_->user_callback) {
    mipsolver.callback_->clearHighsCallbackDataOut();
    if (interruptFromCallbackWithData(kCallbackMipInterrupt,
                                      mipsolver.solution_objective_,
                                      "MIP check limits")) {
      if (mipsolver.modelstatus_ == HighsModelStatus::kNotset) {
        highsLogDev(options.log_options, HighsLogType::kInfo,
                    "User interrupt\n");
        mipsolver.modelstatus_ = HighsModelStatus::kInterrupt;
      }
      return true;
    }
  }
  // Possible termination due to objective being at least as good as
  // the target value
  if (!mipsolver.submip && mipsolver.solution_objective_ < kHighsInf &&
      options.objective_target > -kHighsInf) {
    // Note:
    //
    // Whether the sense is ObjSense::kMinimize or
    // ObjSense::kMaximize, the undefined value of
    // mipsolver.solution_objective_ is kHighsInf, and the default
    // target value is -kHighsInf, so had to rule out these cases in
    // the conditional statement above.
    //
    // mipsolver.solution_objective_ is the actual objective of the
    // MIP - including the offset, and independent of objective sense
    //
    // The target is reached if the objective is below (above) the
    // target value when minimizing (maximizing).
    const int int_sense = int(this->mipsolver.orig_model_->sense_);
    const bool reached_objective_target =
        int_sense * mipsolver.solution_objective_ <
        int_sense * options.objective_target;
    if (reached_objective_target) {
      if (mipsolver.modelstatus_ == HighsModelStatus::kNotset) {
        highsLogDev(options.log_options, HighsLogType::kInfo,
                    "Reached objective target\n");
        mipsolver.modelstatus_ = HighsModelStatus::kObjectiveTarget;
      }
      return true;
    }
  }

  if (options.mip_max_nodes != kHighsIInf &&
      num_nodes + nodeOffset >= options.mip_max_nodes) {
    if (mipsolver.modelstatus_ == HighsModelStatus::kNotset) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Reached node limit\n");
      mipsolver.modelstatus_ = HighsModelStatus::kSolutionLimit;
    }
    return true;
  }

  if (options.mip_max_leaves != kHighsIInf &&
      num_leaves >= options.mip_max_leaves) {
    if (mipsolver.modelstatus_ == HighsModelStatus::kNotset) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Reached leaf node limit\n");
      mipsolver.modelstatus_ = HighsModelStatus::kSolutionLimit;
    }
    return true;
  }

  if (options.mip_max_improving_sols != kHighsIInf &&
      numImprovingSols >= options.mip_max_improving_sols) {
    if (mipsolver.modelstatus_ == HighsModelStatus::kNotset) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Reached improving solution limit\n");
      mipsolver.modelstatus_ = HighsModelStatus::kSolutionLimit;
    }
    return true;
  }

  //  const double time = mipsolver.timer_.read();
  //  printf("checkLimits: time = %g\n", time);
  if (options.time_limit < kHighsInf &&
      mipsolver.timer_.read() >= options.time_limit) {
    if (mipsolver.modelstatus_ == HighsModelStatus::kNotset) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "Reached time limit\n");
      mipsolver.modelstatus_ = HighsModelStatus::kTimeLimit;
    }
    return true;
  }

  return false;
}